

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

Node * __thiscall
SuffixTree::GeneralizedSuffixTree::InsertNode
          (GeneralizedSuffixTree *this,uint letter,uint string,uint pos)

{
  Edge *pEVar1;
  reference pvVar2;
  char *pcVar3;
  Leaf *leaf_;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>,_bool>
  pVar4;
  Edge local_a8;
  _Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false> local_90;
  undefined1 local_88;
  Edge local_80;
  uint local_64;
  _Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false> local_60;
  undefined1 local_58;
  Edge local_50;
  uint local_38;
  uint local_34;
  mapped_type *pmStack_30;
  uint old_pos;
  Edge *edge;
  Node *node;
  uint local_18;
  uint pos_local;
  uint string_local;
  uint letter_local;
  GeneralizedSuffixTree *this_local;
  
  node._4_4_ = pos;
  local_18 = string;
  pos_local = letter;
  _string_local = this;
  if (this->active_length != 0) {
    edge = (Edge *)AllocNode(this,this->active_node,this->root);
    pmStack_30 = std::
                 unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                 ::operator[](&this->active_node->edges,&this->active_edge);
    local_34 = pmStack_30->start + this->active_length;
    if (pmStack_30->length == 0) {
      pEVar1 = edge + 1;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)pmStack_30->string_number);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar2);
      local_64 = MakeLetter(*pcVar3,pmStack_30->string_number);
      Edge::Edge(&local_80,(pmStack_30->field_0).leaf,pmStack_30->string_number,local_34);
      pVar4 = std::
              unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
              ::emplace<unsigned_int,SuffixTree::Edge>
                        ((unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
                          *)&pEVar1->length,&local_64,&local_80);
      local_90._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>._M_cur;
      local_88 = pVar4.second;
      ((pmStack_30->field_0).node)->parent = (Node *)edge;
    }
    else {
      pEVar1 = edge + 1;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)pmStack_30->string_number);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar2);
      local_38 = MakeLetter(*pcVar3,pmStack_30->string_number);
      Edge::Edge(&local_50,(pmStack_30->field_0).node,pmStack_30->string_number,local_34,
                 pmStack_30->length - this->active_length);
      pVar4 = std::
              unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
              ::emplace<unsigned_int,SuffixTree::Edge>
                        ((unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
                          *)&pEVar1->length,&local_38,&local_50);
      local_60._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>._M_cur;
      local_58 = pVar4.second;
      ((pmStack_30->field_0).node)->parent = (Node *)edge;
    }
    pEVar1 = edge + 1;
    leaf_ = AllocLeaf(this,(Node *)edge,local_18);
    Edge::Edge(&local_a8,leaf_,local_18,node._4_4_);
    std::
    unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
    ::emplace<unsigned_int&,SuffixTree::Edge>
              ((unordered_map<unsigned_int,SuffixTree::Edge,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>>
                *)&pEVar1->length,&pos_local,&local_a8);
    (pmStack_30->field_0).node = (Node *)edge;
    pmStack_30->length = this->active_length;
    return (Node *)edge;
  }
  __assert_fail("active_length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0x123,"Node *SuffixTree::GeneralizedSuffixTree::InsertNode(uint, uint, uint)");
}

Assistant:

Node *GeneralizedSuffixTree::InsertNode (uint letter, uint string, uint pos)
{
    // can not insert node if active point is not on edge
    assert (active_length);
    // create node
    Node *node = AllocNode (active_node, root);
    Edge &edge = active_node->edges[active_edge];
    // old branch
    uint old_pos = edge.start + active_length;
    if (edge.length)
    {
        node->edges.emplace (MakeLetter (strings[edge.string_number][old_pos], edge.string_number),
                             Edge (edge.node, edge.string_number, old_pos, edge.length - active_length));
        edge.node->parent = node;
    }
    else
    {
        node->edges.emplace (MakeLetter (strings[edge.string_number][old_pos], edge.string_number),
                             Edge (edge.leaf, edge.string_number, old_pos));
        edge.leaf->parent = node;
    }
    // new leaf
    node->edges.emplace (letter, Edge (AllocLeaf (node, string), string, pos));
    // setup parent
    edge.node = node;
    edge.length = active_length;
    return node;
}